

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdAddTapBranchByScriptTree(void *handle,void *tree_handle,void *branch_tree)

{
  bool bVar1;
  byte bVar2;
  reference branch_00;
  reference this;
  reference this_00;
  long in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  value_type *dest_tree;
  value_type *branch;
  TapBranch *src_tree;
  CfdCapiTapscriptTree *branch_buffer;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_fffffffffffffe48;
  TapBranch *in_stack_fffffffffffffe50;
  TapBranch local_140;
  string local_c8;
  string *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  long local_20;
  long local_18;
  
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TapscriptTree",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"TapscriptTree",&local_81);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_20 + 0x18));
  if (bVar1) {
    branch_00 = std::
                vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                ::at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                      *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    branch_00 = (reference)
                std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                          ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                           in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_18 + 0x18));
  if (bVar1) {
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    cfd::core::TaprootScriptTree::AddBranch(this_00,&branch_00->super_TapBranch);
  }
  else {
    this = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                     ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                      in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_c8,this);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_c8);
    if ((bVar2 & 1) == 0) {
      cfd::core::TapBranch::AddBranch(this,&branch_00->super_TapBranch);
    }
    else {
      cfd::core::TapBranch::TapBranch(&local_140,&branch_00->super_TapBranch);
      cfd::core::TapBranch::operator=(this,&local_140);
      cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffe50);
    }
  }
  return 0;
}

Assistant:

int CfdAddTapBranchByScriptTree(
    void* handle, void* tree_handle, void* branch_tree) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CheckBuffer(branch_tree, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    CfdCapiTapscriptTree* branch_buffer =
        static_cast<CfdCapiTapscriptTree*>(branch_tree);

    TapBranch* src_tree;
    if (!branch_buffer->branch_buffer->empty()) {
      src_tree = &branch_buffer->branch_buffer->at(0);
    } else {
      src_tree = &branch_buffer->tree_buffer->at(0);
    }

    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(*src_tree);  // override
      } else {
        branch.AddBranch(*src_tree);
      }
    } else {
      auto& dest_tree = buffer->tree_buffer->at(0);
      dest_tree.AddBranch(*src_tree);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}